

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.h
# Opt level: O2

void __thiscall CompilerContext::~CompilerContext(CompilerContext *this)

{
  SmallArray<CompilerStatistics::Timer,_16U>::~SmallArray(&(this->statistics).timers);
  InstructionRegVmFinalizeContext::~InstructionRegVmFinalizeContext(&this->instRegVmFinalizeCtx);
  ExpressionContext::~ExpressionContext(&this->exprCtx);
  ParseContext::~ParseContext(&this->parseCtx);
  OutputContext::~OutputContext(&this->outputCtx);
  return;
}

Assistant:

CompilerContext(Allocator *allocator, int optimizationLevel, ArrayView<InplaceStr> activeImports): allocator(allocator), parseCtx(allocator, optimizationLevel, activeImports), exprCtx(allocator, optimizationLevel), instRegVmFinalizeCtx(exprCtx, allocator), optimizationLevel(optimizationLevel)
	{
		code = 0;

		moduleRoot = 0;

		errorPos = 0;
		errorBuf = 0;
		errorBufSize = 0;

		synModule = 0;

		exprModule = 0;
		exprMemoryLimit = 0;

		vmModule = 0;

		llvmModule = 0;

		regVmLoweredModule = 0;

		enableLogFiles = false;
	}